

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Parser::updateFileInfo(Parser *this)

{
  size_type __n;
  reference pvVar1;
  size_type sVar2;
  Token *pTVar3;
  int iVar4;
  size_t index;
  size_t i;
  Parser *this_local;
  
  if ((this->overrideFileInfo & 1U) == 0) {
    for (index = std::vector<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>::size
                           (&this->entries); index != 0; index = index - 1) {
      __n = index - 1;
      pvVar1 = std::vector<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>::operator[]
                         (&this->entries,__n);
      if (((pvVar1->virtualFile & 1U) == 0) &&
         (pvVar1 = std::vector<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>::operator[]
                             (&this->entries,__n), pvVar1->fileNum != -1)) {
        pvVar1 = std::vector<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>::operator[]
                           (&this->entries,__n);
        Global.FileInfo.FileNum = pvVar1->fileNum;
        sVar2 = std::vector<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>::size
                          (&this->entries);
        if (__n != sVar2 - 1) {
          pvVar1 = std::vector<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>::operator[]
                             (&this->entries,__n);
          Global.FileInfo.LineNumber = pvVar1->previousCommandLine;
          return;
        }
        pvVar1 = std::vector<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>::operator[]
                           (&this->entries,__n);
        pTVar3 = Tokenizer::peekToken(pvVar1->tokenizer,0);
        iVar4 = (int)pTVar3->line;
        Global.FileInfo.LineNumber = iVar4;
        pvVar1 = std::vector<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>::operator[]
                           (&this->entries,__n);
        pvVar1->previousCommandLine = iVar4;
        return;
      }
    }
  }
  else {
    Global.FileInfo.FileNum = this->overrideFileNum;
    Global.FileInfo.LineNumber = this->overrideLineNum;
  }
  return;
}

Assistant:

void Parser::updateFileInfo()
{
	if (overrideFileInfo)
	{
		Global.FileInfo.FileNum = overrideFileNum;
		Global.FileInfo.LineNumber = overrideLineNum;
		return;
	}

	for (size_t i = entries.size(); i > 0; i--)
	{
		size_t index = i-1;

		if (!entries[index].virtualFile && entries[index].fileNum != -1)
		{
			Global.FileInfo.FileNum = entries[index].fileNum;

			// if it's not the topmost file, then the command to instantiate the
			// following files was already parsed -> take the previous command's line
			if (index != entries.size() - 1)
				Global.FileInfo.LineNumber = entries[index].previousCommandLine;
			else
			{
				Global.FileInfo.LineNumber = (int)entries[index].tokenizer->peekToken().line;
				entries[index].previousCommandLine = Global.FileInfo.LineNumber;
			}
			return;
		}
	}
}